

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

Int64 Imf_2_5::anon_unknown_0::getBits(int nBits,Int64 *c,int *lc,char **in)

{
  Int64 IVar1;
  byte *pbVar2;
  char **in_local;
  int *lc_local;
  Int64 *c_local;
  int nBits_local;
  
  while (*lc < nBits) {
    IVar1 = *c;
    pbVar2 = (byte *)*in;
    *in = (char *)(pbVar2 + 1);
    *c = IVar1 << 8 | (ulong)*pbVar2;
    *lc = *lc + 8;
  }
  *lc = *lc - nBits;
  return *c >> ((byte)*lc & 0x3f) & (long)((1 << ((byte)nBits & 0x1f)) + -1);
}

Assistant:

inline Int64
getBits (int nBits, Int64 &c, int &lc, const char *&in)
{
    while (lc < nBits)
    {
	c = (c << 8) | *(unsigned char *)(in++);
	lc += 8;
    }

    lc -= nBits;
    return (c >> lc) & ((1 << nBits) - 1);
}